

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePathCommand.cxx
# Opt level: O3

bool anon_unknown.dwarf_7ae818::HandleIsRelativeCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  bool bVar3;
  byte bVar4;
  string inputPath;
  path local_98;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 != 0x60) {
    paVar1 = &local_98._M_pathname.field_2;
    local_98._M_pathname._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"IS_RELATIVE must be called with two arguments.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_pathname._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_pathname._M_dataplus._M_p,
                      local_98._M_pathname.field_2._M_allocated_capacity + 1);
    }
    return false;
  }
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  bVar3 = getInputPath(pbVar2 + 1,status,&local_70);
  if (bVar3) {
    if ((args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start[2]._M_string_length != 0) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,local_70._M_dataplus._M_p,
                 local_70._M_dataplus._M_p + local_70._M_string_length);
      cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
                ((cmCMakePath *)&local_98,&local_50,generic_format);
      bVar4 = std::filesystem::__cxx11::path::has_root_directory();
      std::filesystem::__cxx11::path::~path(&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      bVar3 = true;
      cmMakefile::AddDefinitionBool
                (status->Makefile,
                 (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 2,(bool)(bVar4 ^ 1));
      goto LAB_0024daa2;
    }
    paVar1 = &local_98._M_pathname.field_2;
    local_98._M_pathname._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"Invalid name for output variable.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_pathname._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_pathname._M_dataplus._M_p,
                      local_98._M_pathname.field_2._M_allocated_capacity + 1);
    }
  }
  bVar3 = false;
LAB_0024daa2:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  return bVar3;
}

Assistant:

bool HandleIsRelativeCommand(std::vector<std::string> const& args,
                             cmExecutionStatus& status)
{
  if (args.size() != 3) {
    status.SetError("IS_RELATIVE must be called with two arguments.");
    return false;
  }

  std::string inputPath;
  if (!getInputPath(args[1], status, inputPath)) {
    return false;
  }

  if (args[2].empty()) {
    status.SetError("Invalid name for output variable.");
    return false;
  }

  bool isRelative = cmCMakePath(inputPath).IsRelative();

  status.GetMakefile().AddDefinitionBool(args[2], isRelative);

  return true;
}